

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_right_delim_join.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalRightDelimJoin::Finalize
          (PhysicalRightDelimJoin *this,Pipeline *pipeline,Event *event,ClientContext *client,
          OperatorSinkFinalizeInput *input)

{
  PhysicalOperator *pPVar1;
  PhysicalHashAggregate *pPVar2;
  OperatorSinkFinalizeInput distinct_finalize_input;
  OperatorSinkFinalizeInput join_finalize_input;
  
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::operator*
            (&((this->super_PhysicalDelimJoin).join)->sink_state);
  pPVar1 = (this->super_PhysicalDelimJoin).join;
  (*pPVar1->_vptr_PhysicalOperator[0x1d])(pPVar1,pipeline,event,client);
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::operator*
            (&(((this->super_PhysicalDelimJoin).distinct)->super_PhysicalOperator).sink_state);
  pPVar2 = (this->super_PhysicalDelimJoin).distinct;
  (*(pPVar2->super_PhysicalOperator)._vptr_PhysicalOperator[0x1d])(pPVar2,pipeline,event,client);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalRightDelimJoin::Finalize(Pipeline &pipeline, Event &event, ClientContext &client,
                                                  OperatorSinkFinalizeInput &input) const {
	OperatorSinkFinalizeInput join_finalize_input {*join.sink_state, input.interrupt_state};
	join.Finalize(pipeline, event, client, join_finalize_input);

	OperatorSinkFinalizeInput distinct_finalize_input {*distinct.sink_state, input.interrupt_state};
	distinct.Finalize(pipeline, event, client, distinct_finalize_input);

	return SinkFinalizeType::READY;
}